

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O0

void __thiscall
FIX41::MessageCracker::crack(MessageCracker *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  Header *this_00;
  string *__lhs;
  string *msgTypeValue;
  SessionID *sessionID_local;
  Message *message_local;
  MessageCracker *this_local;
  
  this_00 = FIX41::Message::getHeader(message);
  __lhs = FIX::FieldMap::getField_abi_cxx11_((FieldMap *)this_00,0x23);
  bVar1 = std::operator==(__lhs,"0");
  if (bVar1) {
    (*this->_vptr_MessageCracker[4])(this,message,sessionID);
  }
  else {
    bVar1 = std::operator==(__lhs,"1");
    if (bVar1) {
      (*this->_vptr_MessageCracker[5])(this,message,sessionID);
    }
    else {
      bVar1 = std::operator==(__lhs,"2");
      if (bVar1) {
        (*this->_vptr_MessageCracker[6])(this,message,sessionID);
      }
      else {
        bVar1 = std::operator==(__lhs,"3");
        if (bVar1) {
          (*this->_vptr_MessageCracker[7])(this,message,sessionID);
        }
        else {
          bVar1 = std::operator==(__lhs,"4");
          if (bVar1) {
            (*this->_vptr_MessageCracker[8])(this,message,sessionID);
          }
          else {
            bVar1 = std::operator==(__lhs,"5");
            if (bVar1) {
              (*this->_vptr_MessageCracker[9])(this,message,sessionID);
            }
            else {
              bVar1 = std::operator==(__lhs,"6");
              if (bVar1) {
                (*this->_vptr_MessageCracker[10])(this,message,sessionID);
              }
              else {
                bVar1 = std::operator==(__lhs,"7");
                if (bVar1) {
                  (*this->_vptr_MessageCracker[0xb])(this,message,sessionID);
                }
                else {
                  bVar1 = std::operator==(__lhs,"8");
                  if (bVar1) {
                    (*this->_vptr_MessageCracker[0xc])(this,message,sessionID);
                  }
                  else {
                    bVar1 = std::operator==(__lhs,"9");
                    if (bVar1) {
                      (*this->_vptr_MessageCracker[0xd])(this,message,sessionID);
                    }
                    else {
                      bVar1 = std::operator==(__lhs,"A");
                      if (bVar1) {
                        (*this->_vptr_MessageCracker[0xe])(this,message,sessionID);
                      }
                      else {
                        bVar1 = std::operator==(__lhs,"B");
                        if (bVar1) {
                          (*this->_vptr_MessageCracker[0xf])(this,message,sessionID);
                        }
                        else {
                          bVar1 = std::operator==(__lhs,"C");
                          if (bVar1) {
                            (*this->_vptr_MessageCracker[0x10])(this,message,sessionID);
                          }
                          else {
                            bVar1 = std::operator==(__lhs,"D");
                            if (bVar1) {
                              (*this->_vptr_MessageCracker[0x11])(this,message,sessionID);
                            }
                            else {
                              bVar1 = std::operator==(__lhs,"E");
                              if (bVar1) {
                                (*this->_vptr_MessageCracker[0x12])(this,message,sessionID);
                              }
                              else {
                                bVar1 = std::operator==(__lhs,"F");
                                if (bVar1) {
                                  (*this->_vptr_MessageCracker[0x13])(this,message,sessionID);
                                }
                                else {
                                  bVar1 = std::operator==(__lhs,"G");
                                  if (bVar1) {
                                    (*this->_vptr_MessageCracker[0x14])(this,message,sessionID);
                                  }
                                  else {
                                    bVar1 = std::operator==(__lhs,"H");
                                    if (bVar1) {
                                      (*this->_vptr_MessageCracker[0x15])(this,message,sessionID);
                                    }
                                    else {
                                      bVar1 = std::operator==(__lhs,"J");
                                      if (bVar1) {
                                        (*this->_vptr_MessageCracker[0x16])(this,message,sessionID);
                                      }
                                      else {
                                        bVar1 = std::operator==(__lhs,"K");
                                        if (bVar1) {
                                          (*this->_vptr_MessageCracker[0x17])
                                                    (this,message,sessionID);
                                        }
                                        else {
                                          bVar1 = std::operator==(__lhs,"L");
                                          if (bVar1) {
                                            (*this->_vptr_MessageCracker[0x18])
                                                      (this,message,sessionID);
                                          }
                                          else {
                                            bVar1 = std::operator==(__lhs,"M");
                                            if (bVar1) {
                                              (*this->_vptr_MessageCracker[0x19])
                                                        (this,message,sessionID);
                                            }
                                            else {
                                              bVar1 = std::operator==(__lhs,"N");
                                              if (bVar1) {
                                                (*this->_vptr_MessageCracker[0x1a])
                                                          (this,message,sessionID);
                                              }
                                              else {
                                                bVar1 = std::operator==(__lhs,"P");
                                                if (bVar1) {
                                                  (*this->_vptr_MessageCracker[0x1b])
                                                            (this,message,sessionID);
                                                }
                                                else {
                                                  bVar1 = std::operator==(__lhs,"Q");
                                                  if (bVar1) {
                                                    (*this->_vptr_MessageCracker[0x1c])
                                                              (this,message,sessionID);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,"R");
                                                    if (bVar1) {
                                                      (*this->_vptr_MessageCracker[0x1d])
                                                                (this,message,sessionID);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,"S");
                                                      if (bVar1) {
                                                        (*this->_vptr_MessageCracker[0x1e])
                                                                  (this,message,sessionID);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,"T");
                                                        if (bVar1) {
                                                          (*this->_vptr_MessageCracker[0x1f])
                                                                    (this,message,sessionID);
                                                        }
                                                        else {
                                                          (*this->_vptr_MessageCracker[2])
                                                                    (this,message,sessionID);
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void crack( const Message& message, 
              const FIX::SessionID& sessionID )
  {
    const std::string & msgTypeValue 
      = message.getHeader().getField( FIX::FIELD::MsgType );
    
    
    if( msgTypeValue == "0" )
      return onMessage( (const Heartbeat&)message, sessionID );
    
    if( msgTypeValue == "1" )
      return onMessage( (const TestRequest&)message, sessionID );
    
    if( msgTypeValue == "2" )
      return onMessage( (const ResendRequest&)message, sessionID );
    
    if( msgTypeValue == "3" )
      return onMessage( (const Reject&)message, sessionID );
    
    if( msgTypeValue == "4" )
      return onMessage( (const SequenceReset&)message, sessionID );
    
    if( msgTypeValue == "5" )
      return onMessage( (const Logout&)message, sessionID );
    
    if( msgTypeValue == "6" )
      return onMessage( (const IOI&)message, sessionID );
    
    if( msgTypeValue == "7" )
      return onMessage( (const Advertisement&)message, sessionID );
    
    if( msgTypeValue == "8" )
      return onMessage( (const ExecutionReport&)message, sessionID );
    
    if( msgTypeValue == "9" )
      return onMessage( (const OrderCancelReject&)message, sessionID );
    
    if( msgTypeValue == "A" )
      return onMessage( (const Logon&)message, sessionID );
    
    if( msgTypeValue == "B" )
      return onMessage( (const News&)message, sessionID );
    
    if( msgTypeValue == "C" )
      return onMessage( (const Email&)message, sessionID );
    
    if( msgTypeValue == "D" )
      return onMessage( (const NewOrderSingle&)message, sessionID );
    
    if( msgTypeValue == "E" )
      return onMessage( (const NewOrderList&)message, sessionID );
    
    if( msgTypeValue == "F" )
      return onMessage( (const OrderCancelRequest&)message, sessionID );
    
    if( msgTypeValue == "G" )
      return onMessage( (const OrderCancelReplaceRequest&)message, sessionID );
    
    if( msgTypeValue == "H" )
      return onMessage( (const OrderStatusRequest&)message, sessionID );
    
    if( msgTypeValue == "J" )
      return onMessage( (const Allocation&)message, sessionID );
    
    if( msgTypeValue == "K" )
      return onMessage( (const ListCancelRequest&)message, sessionID );
    
    if( msgTypeValue == "L" )
      return onMessage( (const ListExecute&)message, sessionID );
    
    if( msgTypeValue == "M" )
      return onMessage( (const ListStatusRequest&)message, sessionID );
    
    if( msgTypeValue == "N" )
      return onMessage( (const ListStatus&)message, sessionID );
    
    if( msgTypeValue == "P" )
      return onMessage( (const AllocationInstructionAck&)message, sessionID );
    
    if( msgTypeValue == "Q" )
      return onMessage( (const DontKnowTrade&)message, sessionID );
    
    if( msgTypeValue == "R" )
      return onMessage( (const QuoteRequest&)message, sessionID );
    
    if( msgTypeValue == "S" )
      return onMessage( (const Quote&)message, sessionID );
    
    if( msgTypeValue == "T" )
      return onMessage( (const SettlementInstructions&)message, sessionID );
    
    return onMessage( message, sessionID );
  }